

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifarg(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *ctx_00;
  uint uVar2;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x01') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  uVar2 = (uint)(ctx_00->runcxsp->runsv).runsvnum;
  if (0 < (int)uVar2) {
    runrepush(ctx_00,ctx_00->runcxbp + (-1 - (ulong)(uVar2 & 0x7fffffff)));
    return;
  }
  ctx_00->runcxerr->errcxptr->erraav[0].errastr = "getarg";
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
  runsign(ctx->bifcxrun,0x400);
}

Assistant:

void bifarg(bifcxdef *ctx, int argc)
{
    int argnum;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_NUMBER);
    
    /* get and verify argument number */
    argnum = runpopnum(ctx->bifcxrun);
    if (argnum < 1) runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "getarg");

    runrepush(ctx->bifcxrun, ctx->bifcxrun->runcxbp - argnum - 1);
}